

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O1

GLuint __thiscall
glcts::ViewportArray::Utils::program::getSubroutineIndex
          (program *this,GLchar *subroutine_name,GLenum shader_stage)

{
  ostringstream *this_00;
  int iVar1;
  GLuint GVar2;
  deUint32 err;
  undefined4 extraout_var;
  MessageBuilder *this_01;
  TestError *this_02;
  GLchar *local_1a0;
  undefined1 local_198 [120];
  ios_base local_120 [264];
  
  local_1a0 = subroutine_name;
  iVar1 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
  GVar2 = (**(code **)(CONCAT44(extraout_var,iVar1) + 0xa88))
                    (this->m_program_object_id,shader_stage,local_1a0);
  err = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  glu::checkError(err,"GetSubroutineIndex",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                  ,0x1ca);
  if (GVar2 != 0xffffffff) {
    return GVar2;
  }
  local_198._0_8_ = this->m_context->m_testCtx->m_log;
  this_00 = (ostringstream *)(local_198 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Subroutine: ",0xc);
  this_01 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_198,&local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            (&(this_01->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
             " is not available",0x11);
  tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_120);
  this_02 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_02,"Subroutine is not available",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
             ,0x1d1);
  __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

GLuint Utils::program::getSubroutineIndex(const glw::GLchar* subroutine_name, glw::GLenum shader_stage) const
{
	const glw::Functions& gl	= m_context.getRenderContext().getFunctions();
	GLuint				  index = -1;

	index = gl.getSubroutineIndex(m_program_object_id, shader_stage, subroutine_name);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetSubroutineIndex");

	if (GL_INVALID_INDEX == index)
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Subroutine: " << subroutine_name
											<< " is not available" << tcu::TestLog::EndMessage;

		TCU_FAIL("Subroutine is not available");
	}

	return index;
}